

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# discrete_dist.hpp
# Opt level: O0

void __thiscall
trng::discrete_dist::param_type::param_type
          (param_type *this,vector<double,_std::allocator<double>_> *P)

{
  pointer pdVar1;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var2;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> in_RDI;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff58;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff60;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first_00;
  
  _Var2._M_current = in_RDI._M_current;
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  pdVar1 = (pointer)std::vector<double,_std::allocator<double>_>::size
                              ((vector<double,_std::allocator<double>_> *)_Var2._M_current);
  (((vector<double,_std::allocator<double>_> *)((long)_Var2._M_current + 0x18))->
  super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data._M_start =
       pdVar1;
  __first_00._M_current =
       (double *)
       &(((vector<double,_std::allocator<double>_> *)((long)_Var2._M_current + 0x18))->
        super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_finish;
  pdVar1 = (pointer)int_math::log2_ceil<unsigned_long>((unsigned_long)in_stack_ffffffffffffff60);
  *__first_00._M_current = (double)pdVar1;
  __last._M_current =
       (double *)
       &(((vector<double,_std::allocator<double>_> *)((long)in_RDI._M_current + 0x18))->
        super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage;
  __first._M_current =
       (double *)
       int_math::pow2<unsigned_long>
                 ((unsigned_long)
                  (((vector<double,_std::allocator<double>_> *)((long)in_RDI._M_current + 0x18))->
                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish);
  *__last._M_current = (double)((long)__first._M_current - 1);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)_Var2._M_current,
             (size_type)in_RDI._M_current);
  std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff58);
  std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff58);
  __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::operator+
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
             __last._M_current,(difference_type)in_stack_ffffffffffffff60);
  std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff58);
  _Var2 = std::
          copy_backward<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                    (__first_00,_Var2,in_RDI);
  std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff58);
  std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff58);
  __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::operator+
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
             __last._M_current,(difference_type)_Var2._M_current);
  std::fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,int>
            (__first,__last,(int *)_Var2._M_current);
  update_all_layers((param_type *)__first._M_current);
  return;
}

Assistant:

explicit param_type(std::vector<double> P)
          : P_(std::move(P)),
            N_{P_.size()},
            layers_{int_math::log2_ceil(N_)},
            offset_{int_math::pow2(layers_) - 1} {
        P_.resize(N_ + offset_);
        std::copy_backward(P_.begin(), P_.begin() + N_, P_.end());
        std::fill(P_.begin(), P_.begin() + offset_, 0);
        update_all_layers();
      }